

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_NtkTerSimulate(Au_Ntk_t *p)

{
  ulong *puVar1;
  int iVar2;
  Au_Man_t *pAVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  if (p->pMan->pFuncs != (Abc_Nam_t *)0x0) {
    __assert_fail("p->pMan->pFuncs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                  ,0x57e,"void Au_NtkTerSimulate(Au_Ntk_t *)");
  }
  uVar7 = 0;
  printf("Collapsing model \"%s\"...\n");
  if (0 < (p->vPis).nSize) {
    lVar4 = 0;
    do {
      if ((p->vPis).nSize <= lVar4) goto LAB_001d9def;
      uVar5 = (p->vPis).pArray[lVar4];
      puVar1 = (ulong *)((long)(p->vPages).pArray[(int)uVar5 >> 0xc] + (ulong)((uVar5 & 0xfff) << 4)
                        );
      *puVar1 = *puVar1 | 0xc0000000;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vPis).nSize);
  }
  pAVar3 = p->pMan;
  pAVar3->nPortsC0 = 0.0;
  pAVar3->nPortsC1 = 0.0;
  pAVar3->nPortsNC = 0.0;
  Au_NtkTerSimulate_rec(p);
  iVar2 = (p->vPos).nSize;
  uVar6 = 0;
  if (0 < (long)iVar2) {
    uVar5 = (p->vPos).nSize;
    lVar4 = 0;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    uVar6 = 0;
    uVar7 = 0;
    do {
      if (uVar5 <= iVar2 - 1U) {
LAB_001d9def:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar8 = (p->vPos).pArray[lVar4];
      uVar8 = *(uint *)((long)(p->vPages).pArray[(int)uVar8 >> 0xc] + (ulong)((uVar8 & 0xfff) << 4))
              >> 0x1e;
      uVar6 = (ulong)((int)uVar6 + (uint)(uVar8 == 2));
      uVar7 = uVar7 + (uVar8 == 1);
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  printf("Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n",(ulong)uVar7,uVar6,
         (ulong)(uint)p->nObjs[3]);
  printf(
        "Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n"
        );
  return;
}

Assistant:

void Au_NtkTerSimulate( Au_Ntk_t * p )
{
    Au_Obj_t * pTerm;
    int i, Counter[2] = {0};
    assert( p->pMan->pFuncs == NULL );
    printf( "Collapsing model \"%s\"...\n", Au_NtkName(p) );
    // create PIs
    Au_NtkForEachPi( p, pTerm, i )
        Au_ObjSetXsim( pTerm, AU_VALX );
    // recursively flatten hierarchy
    p->pMan->nPortsC0 = 0;
    p->pMan->nPortsC1 = 0;
    p->pMan->nPortsNC = 0;
    Au_NtkTerSimulate_rec( p );
    // analyze outputs
    Au_NtkForEachPo( p, pTerm, i )
        if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            Counter[0]++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL1 )
            Counter[1]++;
    // print results
    printf( "Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n", 
        Counter[0], Counter[1], Au_NtkPoNum(p) );
    printf( "Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n", 
        p->pMan->nPortsC0, p->pMan->nPortsC1, p->pMan->nPortsNC, p->pMan->nPortsC0 + p->pMan->nPortsC1 + p->pMan->nPortsNC );
}